

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O1

v2d __thiscall
idx2::brick_copier::Copy
          (brick_copier *this,extent *ExtentGlobal,extent *ExtentLocal,brick_volume *Brick)

{
  volume *SVol;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  anon_union_16_4_6ba14846_for_v2<double>_1 aVar1;
  
  aVar1.field_0.Y = (double)in_XMM1_Qa;
  aVar1.field_0.X = (double)in_XMM0_Qa;
  SVol = this->Volume;
  if (SVol->Type == float64) {
    aVar1.field_0 =
         (anon_struct_16_2_94731cea_for_anon_union_16_4_6ba14846_for_v2<double>_1_0)
         CopyExtentExtentMinMax<double,double>(ExtentGlobal,SVol,ExtentLocal,&Brick->Vol);
  }
  else if (SVol->Type == float32) {
    aVar1.field_0 =
         (anon_struct_16_2_94731cea_for_anon_union_16_4_6ba14846_for_v2<double>_1_0)
         CopyExtentExtentMinMax<float,double>(ExtentGlobal,SVol,ExtentLocal,&Brick->Vol);
  }
  return (anon_union_16_4_6ba14846_for_v2<double>_1)
         (anon_union_16_4_6ba14846_for_v2<double>_1)aVar1.field_0;
}

Assistant:

v2d
brick_copier::Copy(const extent& ExtentGlobal, const extent& ExtentLocal, brick_volume* Brick)
{
  v2d MinMax;
  if (Volume->Type == dtype::float32)
    MinMax = (CopyExtentExtentMinMax<f32, f64>(ExtentGlobal, *Volume, ExtentLocal, &Brick->Vol));
  else if (Volume->Type == dtype::float64)
    MinMax = (CopyExtentExtentMinMax<f64, f64>(ExtentGlobal, *Volume, ExtentLocal, &Brick->Vol));

  return MinMax;
}